

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O1

size_t ZSTD_ldm_fillFastTables(ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,void *end)

{
  ZSTD_strategy ZVar1;
  size_t extraout_RAX;
  size_t extraout_RAX_00;
  size_t sVar2;
  
  ZVar1 = cParams->strategy;
  if (ZVar1 == ZSTD_dfast) {
    ZSTD_fillDoubleHashTable(ms,cParams,end,ZSTD_dtlm_fast);
    sVar2 = extraout_RAX_00;
  }
  else {
    if (ZVar1 != ZSTD_fast) {
      return (ulong)ZVar1;
    }
    ZSTD_fillHashTable(ms,cParams,end,ZSTD_dtlm_fast);
    sVar2 = extraout_RAX;
  }
  ms->nextToUpdate = (int)end - *(int *)&(ms->window).base;
  return sVar2;
}

Assistant:

static size_t ZSTD_ldm_fillFastTables(ZSTD_matchState_t* ms,
                                      ZSTD_compressionParameters const* cParams,
                                      void const* end)
{
    const BYTE* const iend = (const BYTE*)end;

    switch(cParams->strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, cParams, iend, ZSTD_dtlm_fast);
        ms->nextToUpdate = (U32)(iend - ms->window.base);
        break;

    case ZSTD_dfast:
        ZSTD_fillDoubleHashTable(ms, cParams, iend, ZSTD_dtlm_fast);
        ms->nextToUpdate = (U32)(iend - ms->window.base);
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
    case ZSTD_btlazy2:
    case ZSTD_btopt:
    case ZSTD_btultra:
        break;
    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    return 0;
}